

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O2

int uv_utf16_to_wtf8(uint16_t *w_source_ptr,ssize_t w_source_len,char **target_ptr,
                    size_t *target_len_ptr)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  if ((target_ptr == (char **)0x0) || (pbVar7 = (byte *)*target_ptr, pbVar7 == (byte *)0x0)) {
    sVar6 = uv_utf16_length_as_wtf8(w_source_ptr,w_source_len);
    if (target_len_ptr != (size_t *)0x0) {
      *target_len_ptr = sVar6;
    }
    if (target_ptr == (char **)0x0) {
      return 0;
    }
    pbVar7 = (byte *)*target_ptr;
    if (pbVar7 == (byte *)0x0) {
      pbVar7 = (byte *)uv__malloc(sVar6 + 1);
      if (pbVar7 == (byte *)0x0) {
        return -0xc;
      }
      *target_ptr = (char *)pbVar7;
    }
  }
  else {
    sVar6 = *target_len_ptr;
  }
  pbVar5 = pbVar7 + sVar6;
  while( true ) {
    pbVar8 = pbVar7;
    if ((pbVar7 == pbVar5) || (w_source_len == 0)) goto LAB_0010a381;
    uVar2 = uv__get_surrogate_value(w_source_ptr,w_source_len);
    if ((w_source_len < 0) && (uVar2 == 0)) break;
    bVar1 = (byte)uVar2;
    if (uVar2 < 0x80) {
      *pbVar7 = bVar1;
      pbVar7 = pbVar7 + 1;
    }
    else if (uVar2 < 0x800) {
      pbVar8 = pbVar7 + 1;
      *pbVar7 = (byte)(uVar2 >> 6) | 0xc0;
      if (pbVar8 == pbVar5) goto LAB_0010a381;
      pbVar7[1] = bVar1 & 0x3f | 0x80;
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar8 = pbVar7 + 1;
      if (uVar2 < 0x10000) {
        *pbVar7 = (byte)(uVar2 >> 0xc) | 0xe0;
        if (pbVar8 == pbVar5) goto LAB_0010a381;
        pbVar8 = pbVar7 + 2;
        pbVar7[1] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        if (pbVar8 == pbVar5) goto LAB_0010a381;
        pbVar7[2] = bVar1 & 0x3f | 0x80;
        pbVar7 = pbVar7 + 3;
      }
      else {
        *pbVar7 = (byte)(uVar2 >> 0x12) | 0xf0;
        if (pbVar8 == pbVar5) goto LAB_0010a381;
        pbVar8 = pbVar7 + 2;
        pbVar7[1] = (byte)(uVar2 >> 0xc) & 0x3f | 0x80;
        if (pbVar8 == pbVar5) goto LAB_0010a381;
        pbVar8 = pbVar7 + 3;
        pbVar7[2] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        if (pbVar8 == pbVar5) goto LAB_0010a381;
        pbVar7[3] = bVar1 & 0x3f | 0x80;
        pbVar7 = pbVar7 + 4;
        w_source_ptr = w_source_ptr + 1;
        w_source_len = w_source_len - (ulong)(0 < w_source_len);
      }
    }
    sVar6 = (long)pbVar7 - (long)*target_ptr;
    w_source_ptr = w_source_ptr + 1;
    w_source_len = w_source_len - (ulong)(0 < w_source_len);
  }
  w_source_len = 0;
LAB_0010a381:
  if ((target_len_ptr != (size_t *)0x0) && (pbVar8 != pbVar5)) {
    *target_len_ptr = (long)pbVar8 - (long)*target_ptr;
  }
  if (((w_source_len < 0) && (pbVar8 == pbVar5)) && (*w_source_ptr == 0)) {
    w_source_len = 0;
  }
  iVar3 = 0;
  if (w_source_len != 0) {
    iVar3 = -0x69;
  }
  *pbVar8 = 0;
  if ((target_len_ptr != (size_t *)0x0) && (w_source_len != 0)) {
    sVar4 = uv_utf16_length_as_wtf8(w_source_ptr,w_source_len);
    *target_len_ptr = sVar4 + sVar6;
    iVar3 = -0x69;
  }
  return iVar3;
}

Assistant:

int uv_utf16_to_wtf8(const uint16_t* w_source_ptr,
                     ssize_t w_source_len,
                     char** target_ptr,
                     size_t* target_len_ptr) {
  size_t target_len;
  char* target;
  char* target_end;
  int32_t code_point;

  /* If *target_ptr is provided, then *target_len_ptr must be its length
   * (excluding space for NUL), otherwise we will compute the target_len_ptr
   * length and may return a new allocation in *target_ptr if target_ptr is
   * provided. */
  if (target_ptr == NULL || *target_ptr == NULL) {
    target_len = uv_utf16_length_as_wtf8(w_source_ptr, w_source_len);
    if (target_len_ptr != NULL)
      *target_len_ptr = target_len;
  } else {
    target_len = *target_len_ptr;
  }

  if (target_ptr == NULL)
    return 0;

  if (*target_ptr == NULL) {
    target = uv__malloc(target_len + 1);
    if (target == NULL) {
      return UV_ENOMEM;
    }
    *target_ptr = target;
  } else {
    target = *target_ptr;
  }

  target_end = target + target_len;

  while (target != target_end && w_source_len) {
    code_point = uv__get_surrogate_value(w_source_ptr, w_source_len);
    /* Can be invalid UTF-8 but must be valid WTF-8. */
    assert(code_point >= 0);
    if (w_source_len < 0 && code_point == 0) {
      w_source_len = 0;
      break;
    }
    if (code_point < 0x80) {
      *target++ = code_point;
    } else if (code_point < 0x800) {
      *target++ = 0xC0 | (code_point >> 6);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
    } else if (code_point < 0x10000) {
      *target++ = 0xE0 | (code_point >> 12);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 6) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
    } else {
      *target++ = 0xF0 | (code_point >> 18);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 12) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 6) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
      /* uv__get_surrogate_value consumed 2 input characters */
      w_source_ptr++;
      if (w_source_len > 0)
        w_source_len--;
    }
    target_len = target - *target_ptr;
    w_source_ptr++;
    if (w_source_len > 0)
      w_source_len--;
  }

  if (target != target_end && target_len_ptr != NULL)
    /* Did not fill all of the provided buffer, so update the target_len_ptr
     * output with the space used. */
    *target_len_ptr = target - *target_ptr;

  /* Check if input fit into target exactly. */
  if (w_source_len < 0 && target == target_end && w_source_ptr[0] == 0)
    w_source_len = 0;

  *target++ = '\0';

  /* Characters remained after filling the buffer, compute the remaining length now. */
  if (w_source_len) {
    if (target_len_ptr != NULL)
      *target_len_ptr = target_len + uv_utf16_length_as_wtf8(w_source_ptr, w_source_len);
    return UV_ENOBUFS;
  }

  return 0;
}